

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O3

bool ApplyEnclosesArgs(ParseNode *fncDecl,ByteCodeGenerator *byteCodeGenerator)

{
  byte bVar1;
  ParseNodeFnc *pPVar2;
  ParseNodeVisitor<ApplyCheck> prefix;
  ParseNodeVisitor<ApplyCheck> postfix;
  ApplyCheck local_23 [2];
  ApplyCheck applyCheck;
  
  bVar1 = byteCodeGenerator->m_utf8SourceInfo->field_0xa8;
  if ((((byte)((bVar1 >> 5 |
               (byteCodeGenerator->m_utf8SourceInfo->debugModeSource).ptr != (uchar *)0x0) &
              (bVar1 & 0x40) >> 6) == 0) &&
      (((fncDecl->nop != knopFncDecl || ((fncDecl->grfpn & 4) == 0)) &&
       (pPVar2 = ParseNode::AsParseNodeFnc(fncDecl), pPVar2->pnodeParams == (ParseNodePtr)0x0)))) &&
     ((pPVar2 = ParseNode::AsParseNodeFnc(fncDecl), pPVar2->pnodeRest == (ParseNodePtr)0x0 &&
      (pPVar2 = ParseNode::AsParseNodeFnc(fncDecl), pPVar2->nestedCount == 0)))) {
    local_23[0].matches = true;
    local_23[0].insideApplyCall = false;
    local_23[0].sawApply = false;
    pPVar2 = ParseNode::AsParseNodeFnc(fncDecl);
    prefix.m_fn = CheckApplyEnclosesArgs;
    prefix.m_context = local_23;
    postfix.m_fn = PostCheckApplyEnclosesArgs;
    postfix.m_context = local_23;
    Visit<ParseNodeVisitor<ApplyCheck>,ParseNodeVisitor<ApplyCheck>>
              (pPVar2->pnodeBody,byteCodeGenerator,prefix,postfix,(ParseNode *)0x0);
    return (bool)(local_23[0].sawApply & local_23[0].matches);
  }
  return false;
}

Assistant:

bool ApplyEnclosesArgs(ParseNode* fncDecl, ByteCodeGenerator* byteCodeGenerator)
{
    if (byteCodeGenerator->IsInDebugMode())
    {
        // Inspection of the arguments object will be messed up if we do ApplyArgs.
        return false;
    }

    if (!fncDecl->HasVarArguments()
        && fncDecl->AsParseNodeFnc()->pnodeParams == nullptr
        && fncDecl->AsParseNodeFnc()->pnodeRest == nullptr
        && fncDecl->AsParseNodeFnc()->nestedCount == 0)
    {
        ApplyCheck applyCheck;
        applyCheck.matches = true;
        applyCheck.sawApply = false;
        applyCheck.insideApplyCall = false;
        VisitIndirect<ApplyCheck>(fncDecl->AsParseNodeFnc()->pnodeBody, byteCodeGenerator, &applyCheck, &CheckApplyEnclosesArgs, &PostCheckApplyEnclosesArgs);
        return applyCheck.matches&&applyCheck.sawApply;
    }

    return false;
}